

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_CLZ(DisasContext_conflict1 *s,arg_CLZ *a)

{
  int reg;
  ulong uVar1;
  TCGContext_conflict1 *s_00;
  TCGTemp *pTVar2;
  TCGv_i32 var;
  TCGContext_conflict1 *tcg_ctx;
  
  uVar1 = s->features;
  if ((short)uVar1 < 0) {
    s_00 = s->uc->tcg_ctx;
    reg = a->rm;
    pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar2 - (long)s_00);
    load_reg_var(s,var,reg);
    tcg_gen_clzi_i32_aarch64(s_00,var,var,0x20);
    store_reg(s,a->rd,var);
  }
  return SUB81((uVar1 & 0xffff) >> 0xf,0);
}

Assistant:

static bool trans_CLZ(DisasContext *s, arg_CLZ *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!ENABLE_ARCH_5) {
        return false;
    }
    tmp = load_reg(s, a->rm);
    tcg_gen_clzi_i32(tcg_ctx, tmp, tmp, 32);
    store_reg(s, a->rd, tmp);
    return true;
}